

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall VulkanHppGenerator::filterLenMembers(VulkanHppGenerator *this)

{
  int line;
  _Base_ptr p_Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar2;
  _Base_ptr p_Var3;
  MemberData *pMVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  _Rb_tree_node_base *p_Var8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
  *this_00;
  long lVar9;
  VulkanHppGenerator *this_01;
  const_iterator __first;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *__x;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar10;
  long lVar11;
  _Base_ptr name;
  undefined1 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var8 = (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = &this->m_constants;
  do {
    if ((_Rb_tree_header *)p_Var8 == &(this->m_structs)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var1 = *(_Base_ptr *)(p_Var8 + 4);
    for (p_Var6 = p_Var8[3]._M_right; p_Var6 != p_Var1; p_Var6 = (_Base_ptr)&p_Var6[0xc]._M_right) {
      this_01 = (VulkanHppGenerator *)&p_Var6[7]._M_left;
      __x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *)p_Var6[7]._M_left;
      ppVar2 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)p_Var6[7]._M_right;
      lVar11 = (long)ppVar2 - (long)__x;
      for (lVar9 = lVar11 / 0x28 >> 2; ppVar10 = __x, 0 < lVar9; lVar9 = lVar9 + -1) {
        bVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                ::contains(this_00,&__x->first);
        if (bVar5) goto LAB_00109cd3;
        bVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                ::contains(this_00,&__x[1].first);
        ppVar10 = __x + 1;
        if (bVar5) goto LAB_00109cd3;
        bVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                ::contains(this_00,&__x[2].first);
        ppVar10 = __x + 2;
        if (bVar5) goto LAB_00109cd3;
        bVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                ::contains(this_00,&__x[3].first);
        ppVar10 = __x + 3;
        if (bVar5) goto LAB_00109cd3;
        __x = __x + 4;
        lVar11 = lVar11 + -0xa0;
      }
      lVar11 = lVar11 / 0x28;
      if (lVar11 == 1) {
LAB_00109eaf:
        bVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                ::contains(this_00,&__x->first);
        ppVar10 = __x;
        if (!bVar5) {
          ppVar10 = ppVar2;
        }
LAB_00109cd3:
        __first._M_current = ppVar10;
        if (ppVar10 != ppVar2) {
          while (ppVar10 = ppVar10 + 1, ppVar10 != ppVar2) {
            bVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                    ::contains(this_00,&ppVar10->first);
            if (!bVar5) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
              ::operator=(__first._M_current,ppVar10);
              __first._M_current = __first._M_current + 1;
            }
          }
        }
      }
      else {
        if (lVar11 == 2) {
LAB_00109caa:
          bVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                  ::contains(this_00,&__x->first);
          ppVar10 = __x;
          if (!bVar5) {
            __x = __x + 1;
            goto LAB_00109eaf;
          }
          goto LAB_00109cd3;
        }
        __first._M_current = ppVar2;
        if (lVar11 == 3) {
          bVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::ConstantData>_>_>
                  ::contains(this_00,&__x->first);
          if (!bVar5) {
            __x = __x + 1;
            goto LAB_00109caa;
          }
          goto LAB_00109cd3;
        }
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::erase((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)this_01,__first,
              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)p_Var6[7]._M_right);
      p_Var3 = p_Var6[7]._M_right;
      for (name = p_Var6[7]._M_left; name != p_Var3; name = (_Base_ptr)&name[1]._M_parent) {
        if (*(long *)(name + 1) == -1) {
          cVar7 = findStructMemberIt(this_01,(string *)name,
                                     (vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                                      *)&p_Var8[3]._M_right);
          pMVar4 = *(MemberData **)(p_Var8 + 4);
          line = *(int *)&p_Var6[0xc]._M_left;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,"struct member <",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var6 + 4));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f0 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,"> uses unknown len member <");
          std::operator+(&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_f0 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
          std::operator+(&local_90,&local_b0,"> in its \"altlen\" attribute <");
          std::operator+(&local_70,&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var6[6]._M_right);
          std::operator+(&local_50,&local_70,">");
          checkForError(cVar7._M_current != pMVar4,line,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)(local_f0 + 0x20));
          this_01 = (VulkanHppGenerator *)local_f0;
          std::__cxx11::string::~string((string *)this_01);
          *(long *)(name + 1) = ((long)cVar7._M_current - (long)p_Var8[3]._M_right) / 0x198;
        }
      }
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void VulkanHppGenerator::filterLenMembers()
{
  for ( auto & sd : m_structs )
  {
    for ( auto & member : sd.second.members )
    {
      std::erase_if( member.lenMembers, [this]( std::pair<std::string, size_t> const & nameIndex ) { return m_constants.contains( nameIndex.first ); } );

      for ( auto & lenMember : member.lenMembers )
      {
        if ( lenMember.second == static_cast<size_t>( ~0 ) )
        {
          auto lenMemberIt = findStructMemberIt( lenMember.first, sd.second.members );
          checkForError( lenMemberIt != sd.second.members.end(),
                         member.xmlLine,
                         "struct member <" + member.name + "> uses unknown len member <" + lenMember.first + "> in its \"altlen\" attribute <" +
                           member.lenExpressions[0] + ">" );
          lenMember.second = std::distance( sd.second.members.cbegin(), lenMemberIt );
        }
      }
    }
  }
}